

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

bool __thiscall
QPDFWriter::willFilterStream
          (QPDFWriter *this,QPDFObjectHandle *stream,bool *compress_stream,bool *is_root_metadata,
          string *stream_data)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  undefined7 extraout_var;
  qpdf_stream_decode_level_e decode_level;
  bool *pbVar6;
  ulong uVar7;
  uint encode_flags;
  byte bVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  QPDFObjectHandle filter_obj;
  PipelinePopper pp_stream_data;
  QPDFObjectHandle stream_dict;
  QPDFObjGen old_og;
  bool local_149;
  QPDFObjectHandle local_140 [2];
  undefined2 local_11e;
  uint local_11c;
  string *local_118;
  bool *local_f0;
  string local_e8;
  ulong local_c8;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_c0;
  PipelinePopper local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [4];
  string local_50;
  
  *compress_stream = false;
  *is_root_metadata = false;
  pbVar6 = is_root_metadata;
  local_f0 = compress_stream;
  local_98[0]._0_8_ = QPDFObjectHandle::getObjGen(stream);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_a8);
  bVar2 = QPDFObjectHandle::isRootMetadata(stream);
  if (bVar2) {
    *is_root_metadata = true;
  }
  bVar2 = QPDFObjectHandle::isDataModified(stream);
  bVar10 = true;
  if ((!bVar2) &&
     (peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1->compress_streams == false)) {
    bVar10 = peVar1->stream_decode_level != qpdf_dl_none;
  }
  bVar3 = QPDFObjectHandle::getFilterOnWrite(stream);
  bVar2 = false;
  local_11c = 0;
  if ((bVar3) &&
     (bVar2 = bVar10,
     ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     compress_streams == true)) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"/Filter","");
    QPDFObjectHandle::getKey(local_140,(string *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (((((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          recompress_flate != false) || (bVar2 = QPDFObjectHandle::isDataModified(stream), bVar2))
       || (bVar2 = QPDFObjectHandle::isName(local_140), !bVar2)) {
      bVar2 = false;
      bVar11 = false;
      uVar7 = 0;
    }
    else {
      QPDFObjectHandle::getName_abi_cxx11_(&local_e8,local_140);
      iVar4 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar4 == 0) {
        bVar11 = true;
        bVar2 = false;
        uVar7 = CONCAT71((int7)((ulong)pbVar6 >> 8),1);
      }
      else {
        QPDFObjectHandle::getName_abi_cxx11_(&local_50,local_140);
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        uVar7 = CONCAT71((int7)((ulong)pbVar6 >> 8),iVar4 == 0);
        bVar2 = true;
        bVar11 = true;
      }
    }
    if ((bVar2) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      local_118 = (string *)CONCAT44(local_118._4_4_,(int)uVar7);
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      uVar7 = (ulong)local_118 & 0xffffffff;
    }
    if ((bVar11) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2)) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
    if ((char)uVar7 == '\0') {
      bVar2 = bVar10;
    }
    if (local_140[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_140[0].super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  local_149 = true;
  local_118 = stream_data;
  if (!bVar3) goto LAB_001ef1ae;
  if (*is_root_metadata == true) {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar11 = false;
    bVar10 = true;
    if ((peVar1->encrypted == true) && (bVar11 = false, peVar1->encrypt_metadata != false))
    goto LAB_001ef12f;
  }
  else {
LAB_001ef12f:
    if (!bVar3) goto LAB_001ef1ae;
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->normalize_content == true) {
      cVar5 = std::
              _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
              ::find(&(peVar1->normalized_streams)._M_t,(key_type *)(local_a8 + 0x10));
      bVar11 = cVar5._M_node ==
               &(peVar1->normalized_streams)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar10 = true;
      if (bVar11) {
        bVar10 = bVar2;
      }
      if (!bVar11 || !bVar3) {
        local_11c = (uint)!bVar11 * 2;
        bVar2 = bVar10;
        goto LAB_001ef1ae;
      }
    }
    else if (!bVar3) goto LAB_001ef1ae;
    if (bVar2 == false) goto LAB_001ef1ae;
    bVar11 = true;
    bVar10 = bVar2;
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        compress_streams != true) {
      local_149 = true;
      goto LAB_001ef1ae;
    }
  }
  bVar2 = bVar10;
  *local_f0 = bVar11;
  local_149 = bVar11;
LAB_001ef1ae:
  local_11e = 1;
  lVar9 = 0;
  local_c8 = 0;
  do {
    bVar10 = *(bool *)((long)&local_11e + lVar9);
    local_b8.stack_id = 0;
    local_b8.qw = this;
    if (local_118 == (string *)0x0) {
      local_c0._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
           (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
      activatePipelineStack
                (this,&local_b8,true,(string *)0x0,
                 (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_c0);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_c0);
    }
    else {
      activatePipelineStack(this,&local_b8,local_118);
    }
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    encode_flags = *local_f0 | local_11c;
    if (bVar2 == false) {
      encode_flags = 0;
    }
    if ((bVar2 & local_149) == 1) {
      decode_level = peVar1->stream_decode_level;
    }
    else {
      decode_level = (uint)bVar2 * 3;
    }
    bVar10 = QPDFObjectHandle::pipeStreamData
                       (stream,&peVar1->pipeline->super_Pipeline,encode_flags,decode_level,false,
                        bVar10);
    local_c8 = CONCAT71(extraout_var,bVar10) & 0xffffffff;
    iVar4 = 2;
    if (bVar2 == true && !bVar10) {
      iVar4 = 0;
      QPDFObjectHandle::setFilterOnWrite(stream,false);
      if (local_118 == (string *)0x0) {
        bVar2 = false;
      }
      else {
        local_118->_M_string_length = 0;
        *(local_118->_M_dataplus)._M_p = '\0';
        bVar2 = false;
        iVar4 = 0;
      }
    }
    PipelinePopper::~PipelinePopper(&local_b8);
  } while (((iVar4 == 3) || (iVar4 == 0)) && (lVar9 = lVar9 + 1, lVar9 != 2));
  bVar8 = (byte)local_c8;
  if ((local_c8 & 1) == 0) {
    *local_f0 = false;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool
QPDFWriter::willFilterStream(
    QPDFObjectHandle stream,
    bool& compress_stream,  // out only
    bool& is_root_metadata, // out only
    std::string* stream_data)
{
    compress_stream = false;
    is_root_metadata = false;

    QPDFObjGen old_og = stream.getObjGen();
    QPDFObjectHandle stream_dict = stream.getDict();

    if (stream.isRootMetadata()) {
        is_root_metadata = true;
    }
    bool filter = stream.isDataModified() || m->compress_streams || m->stream_decode_level;
    bool filter_on_write = stream.getFilterOnWrite();
    if (!filter_on_write) {
        QTC::TC("qpdf", "QPDFWriter getFilterOnWrite false");
        filter = false;
    }
    if (filter_on_write && m->compress_streams) {
        // Don't filter if the stream is already compressed with FlateDecode. This way we don't make
        // it worse if the original file used a better Flate algorithm, and we don't spend time and
        // CPU cycles uncompressing and recompressing stuff. This can be overridden with
        // setRecompressFlate(true).
        QPDFObjectHandle filter_obj = stream_dict.getKey("/Filter");
        if (!m->recompress_flate && !stream.isDataModified() && filter_obj.isName() &&
            (filter_obj.getName() == "/FlateDecode" || filter_obj.getName() == "/Fl")) {
            QTC::TC("qpdf", "QPDFWriter not recompressing /FlateDecode");
            filter = false;
        }
    }
    bool normalize = false;
    bool uncompress = false;
    if (filter_on_write && is_root_metadata && (!m->encrypted || !m->encrypt_metadata)) {
        QTC::TC("qpdf", "QPDFWriter not compressing metadata");
        filter = true;
        compress_stream = false;
        uncompress = true;
    } else if (filter_on_write && m->normalize_content && m->normalized_streams.count(old_og)) {
        normalize = true;
        filter = true;
    } else if (filter_on_write && filter && m->compress_streams) {
        compress_stream = true;
        QTC::TC("qpdf", "QPDFWriter compressing uncompressed stream");
    }

    bool filtered = false;
    for (bool first_attempt: {true, false}) {
        PipelinePopper pp_stream_data(this);
        if (stream_data != nullptr) {
            activatePipelineStack(pp_stream_data, *stream_data);
        } else {
            activatePipelineStack(pp_stream_data, true);
        }
        try {
            filtered = stream.pipeStreamData(
                m->pipeline,
                !filter ? 0
                        : ((normalize ? qpdf_ef_normalize : 0) |
                           (compress_stream ? qpdf_ef_compress : 0)),
                !filter ? qpdf_dl_none : (uncompress ? qpdf_dl_all : m->stream_decode_level),
                false,
                first_attempt);
            if (filter && !filtered) {
                // Try again
                filter = false;
                stream.setFilterOnWrite(false);
            } else {
                break;
            }
        } catch (std::runtime_error& e) {
            if (filter && first_attempt) {
                stream.warnIfPossible("error while getting stream data: "s + e.what());
                stream.warnIfPossible("qpdf will attempt to write the damaged stream unchanged");
                filter = false;
                stream.setFilterOnWrite(false);
                continue;
            }
            throw std::runtime_error(
                "error while getting stream data for " + stream.unparse() + ": " + e.what());
        }
        if (stream_data) {
            stream_data->clear();
        }
    }
    if (!filtered) {
        compress_stream = false;
    }
    return filtered;
}